

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::udp_socket::set_proxy_settings
          (udp_socket *this,proxy_settings *ps,alert_manager *alerts,resolver_interface *resolver,
          bool send_local_ep)

{
  socks5 *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  proxy_type_t pVar2;
  undefined1 uVar3;
  uint16_t uVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool local_3a;
  undefined1 local_39;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  this_00 = (this->m_socks5_connection).
            super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_3a = send_local_ep;
  if (this_00 != (socks5 *)0x0) {
    socks5::close(this_00,(int)ps);
    p_Var1 = (this->m_socks5_connection).
             super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_socks5_connection).
    super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->m_socks5_connection).
    super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
  }
  ::std::__cxx11::string::_M_assign((string *)&this->m_proxy_settings);
  ::std::__cxx11::string::_M_assign((string *)&(this->m_proxy_settings).username);
  ::std::__cxx11::string::_M_assign((string *)&(this->m_proxy_settings).password);
  pVar2 = ps->type;
  uVar3 = ps->field_0x61;
  uVar4 = ps->port;
  *(undefined4 *)((long)&(this->m_proxy_settings).port + 1) = *(undefined4 *)((long)&ps->port + 1);
  (this->m_proxy_settings).type = pVar2;
  (this->m_proxy_settings).field_0x61 = uVar3;
  (this->m_proxy_settings).port = uVar4;
  if (((this->field_0xf0 & 1) == 0) && ((ps->type & ~socks4) == socks5)) {
    ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<libtorrent::aux::socks5>,boost::asio::io_context&,libtorrent::aux::listen_socket_handle&,libtorrent::aux::alert_manager&,libtorrent::aux::resolver_interface&,bool_const&>
              ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<libtorrent::aux::socks5> *)&local_39,this->m_ioc,&this->m_listen_socket,
               alerts,resolver,&local_3a);
    p_Var6 = p_Stack_30;
    peVar5 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->m_socks5_connection).
             super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_socks5_connection).
    super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    (this->m_socks5_connection).
    super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var6;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
    }
    socks5::start((this->m_socks5_connection).
                  super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ps)
    ;
  }
  return;
}

Assistant:

void udp_socket::set_proxy_settings(aux::proxy_settings const& ps
	, aux::alert_manager& alerts, aux::resolver_interface& resolver, bool const send_local_ep)
{
	TORRENT_ASSERT(is_single_thread());

	if (m_socks5_connection)
	{
		m_socks5_connection->close();
		m_socks5_connection.reset();
	}

	m_proxy_settings = ps;

	if (m_abort) return;

	if (ps.type == settings_pack::socks5
		|| ps.type == settings_pack::socks5_pw)
	{
		// connect to socks5 server and open up the UDP tunnel

		m_socks5_connection = std::make_shared<socks5>(m_ioc
			, m_listen_socket, alerts, resolver, send_local_ep);
		m_socks5_connection->start(ps);
	}
}